

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_create_editor(_glist *x)

{
  t_editor *ptVar1;
  _binbuf *p_Var2;
  t_symbol *sym;
  _guiconnect *p_Var3;
  t_object *who;
  t_gobj *x_00;
  char buf [40];
  char acStack_48 [48];
  
  if (x->gl_editor != (t_editor *)0x0) {
    return;
  }
  ptVar1 = (t_editor *)getbytes(0xa0);
  p_Var2 = binbuf_new();
  ptVar1->e_connectbuf = p_Var2;
  p_Var2 = binbuf_new();
  ptVar1->e_deleted = p_Var2;
  ptVar1->e_glist = x;
  sprintf(acStack_48,".x%lx",x);
  sym = gensym(acStack_48);
  p_Var3 = guiconnect_new((t_pd *)x,sym);
  ptVar1->e_guiconnect = p_Var3;
  ptVar1->e_clock = (_clock *)0x0;
  x->gl_editor = ptVar1;
  for (x_00 = x->gl_list; x_00 != (t_gobj *)0x0; x_00 = x_00->g_next) {
    who = pd_checkobject(&x_00->g_pd);
    if (who != (t_object *)0x0) {
      rtext_new(x,who);
    }
  }
  return;
}

Assistant:

void canvas_create_editor(t_glist *x)
{
    t_gobj *y;
    t_object *ob;
    if (!x->gl_editor)
    {
        x->gl_editor = editor_new(x);
        for (y = x->gl_list; y; y = y->g_next)
            if ((ob = pd_checkobject(&y->g_pd)))
                rtext_new(x, ob);
    }
}